

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderDiscardTests.cpp
# Opt level: O0

int __thiscall
vkt::sr::anon_unknown_0::ShaderDiscardTests::init(ShaderDiscardTests *this,EVP_PKEY_CTX *ctx)

{
  ShaderDiscardCase *node;
  ShaderDiscardTests *pSVar1;
  MovePtr<vkt::sr::(anonymous_namespace)::ShaderDiscardCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderDiscardCase>_>
  local_28;
  DiscardMode local_18;
  DiscardTemplate local_14;
  int mode;
  int tmpl;
  ShaderDiscardTests *this_local;
  
  local_14 = DISCARDTEMPLATE_MAIN_BASIC;
  pSVar1 = this;
  _mode = this;
  while ((int)local_14 < 5) {
    for (local_18 = DISCARDMODE_ALWAYS; (int)local_18 < 5; local_18 = local_18 + DISCARDMODE_NEVER)
    {
      makeDiscardCase(&local_28,(this->super_TestCaseGroup).super_TestNode.m_testCtx,local_14,
                      local_18);
      node = de::details::
             MovePtr<vkt::sr::(anonymous_namespace)::ShaderDiscardCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderDiscardCase>_>
             ::release(&local_28);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)node);
      de::details::
      MovePtr<vkt::sr::(anonymous_namespace)::ShaderDiscardCase,_de::DefaultDeleter<vkt::sr::(anonymous_namespace)::ShaderDiscardCase>_>
      ::~MovePtr(&local_28);
    }
    local_14 = local_14 + DISCARDTEMPLATE_FUNCTION_BASIC;
    pSVar1 = (ShaderDiscardTests *)(ulong)local_14;
  }
  return (int)pSVar1;
}

Assistant:

void ShaderDiscardTests::init (void)
{
	for (int tmpl = 0; tmpl < DISCARDTEMPLATE_LAST; tmpl++)
		for (int mode = 0; mode < DISCARDMODE_LAST; mode++)
			addChild(makeDiscardCase(m_testCtx, (DiscardTemplate)tmpl, (DiscardMode)mode).release());
}